

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

type __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
as<(anonymous_namespace)::ns::Color>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  undefined8 uVar1;
  bool bVar2;
  pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__it;
  pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar3;
  system_error *psVar4;
  pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar5;
  pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar6;
  long lVar7;
  string_view_type sVar8;
  string_view_type sVar9;
  pair<const_std::pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_std::pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  pVar10;
  error_code __ec;
  error_code __ec_00;
  string_view_type s;
  string local_70;
  error_code local_50;
  error_code local_40;
  
  bVar2 = json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_(anonymous_namespace)::ns::Color,_void>
          ::is(this);
  if (!bVar2) {
    psVar4 = (system_error *)__cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>(&local_50,conversion_failed);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70.field_2._M_allocated_capacity._0_7_ = 0x6e206120746f4e;
    local_70.field_2._7_4_ = 0x433a3a73;
    local_70.field_2._11_4_ = 0x726f6c6f;
    local_70._M_string_length = 0xf;
    local_70.field_2._M_local_buf[0xf] = '\0';
    __ec._0_8_ = local_50._0_8_ & 0xffffffff;
    *(undefined ***)(psVar4 + 0x50) = &PTR__json_exception_00b58738;
    __ec._M_cat = local_50._M_cat;
    std::system_error::system_error(psVar4,__ec,&local_70);
    *(undefined8 *)psVar4 = 0xb5b5d8;
    *(undefined8 *)(psVar4 + 0x50) = 0xb5b610;
    *(undefined8 *)(psVar4 + 0x20) = 0;
    *(undefined8 *)(psVar4 + 0x28) = 0;
    *(system_error **)(psVar4 + 0x30) = psVar4 + 0x40;
    *(undefined8 *)(psVar4 + 0x38) = 0;
    psVar4[0x40] = (system_error)0x0;
    __cxa_throw(psVar4,&conv_error::typeinfo,conv_error::~conv_error);
  }
  sVar8 = as_string_view(this);
  sVar9 = as_string_view(this);
  local_50._0_8_ = sVar9._M_len;
  local_50._M_cat = (error_category *)sVar8._M_str;
  pVar10 = json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>
           ::get_values_abi_cxx11_();
  __it = pVar10.first;
  pVar10 = json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>
           ::get_values_abi_cxx11_();
  uVar1 = local_50._0_8_;
  ppVar6 = pVar10.second;
  if (local_50._0_8_ == 0) {
    lVar7 = ((long)ppVar6 - (long)__it >> 3) * -0x3333333333333333 >> 2;
    ppVar3 = __it;
    if (0 < lVar7) {
      ppVar3 = __it + lVar7 * 4;
      lVar7 = lVar7 + 1;
      ppVar5 = __it + 2;
      do {
        if (ppVar5[-2].first == yellow) {
          ppVar5 = ppVar5 + -2;
          goto LAB_00772c91;
        }
        if (ppVar5[-1].first == yellow) {
          ppVar5 = ppVar5 + -1;
          goto LAB_00772c91;
        }
        if (ppVar5->first == yellow) goto LAB_00772c91;
        if (ppVar5[1].first == yellow) {
          ppVar5 = ppVar5 + 1;
          goto LAB_00772c91;
        }
        lVar7 = lVar7 + -1;
        ppVar5 = ppVar5 + 4;
      } while (1 < lVar7);
    }
    lVar7 = ((long)ppVar6 - (long)ppVar3 >> 3) * -0x3333333333333333;
    if (lVar7 == 1) {
LAB_00772c6f:
      ppVar5 = ppVar3;
      if (ppVar3->first != yellow) {
        ppVar5 = ppVar6;
      }
    }
    else if (lVar7 == 2) {
LAB_00772c66:
      ppVar5 = ppVar3;
      if (ppVar3->first != yellow) {
        ppVar3 = ppVar3 + 1;
        goto LAB_00772c6f;
      }
    }
    else {
      ppVar5 = ppVar6;
      if ((lVar7 == 3) && (ppVar5 = ppVar3, ppVar3->first != yellow)) {
        ppVar3 = ppVar3 + 1;
        goto LAB_00772c66;
      }
    }
LAB_00772c91:
    if (ppVar5 == ppVar6) {
      return yellow;
    }
  }
  local_70._M_dataplus._M_p = (pointer)&local_50;
  lVar7 = ((long)ppVar6 - (long)__it >> 3) * -0x3333333333333333 >> 2;
  ppVar3 = __it;
  if (0 < lVar7) {
    ppVar3 = __it + lVar7 * 4;
    lVar7 = lVar7 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::{lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)#2}>
              ::operator()((_Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::_lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)_2_>
                            *)&local_70,__it);
      ppVar5 = __it;
      if (bVar2) goto LAB_00772dbd;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::{lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)#2}>
              ::operator()((_Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::_lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)_2_>
                            *)&local_70,__it + 1);
      ppVar5 = __it + 1;
      if (bVar2) goto LAB_00772dbd;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::{lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)#2}>
              ::operator()((_Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::_lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)_2_>
                            *)&local_70,__it + 2);
      ppVar5 = __it + 2;
      if (bVar2) goto LAB_00772dbd;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::{lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)#2}>
              ::operator()((_Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::_lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)_2_>
                            *)&local_70,__it + 3);
      ppVar5 = __it + 3;
      if (bVar2) goto LAB_00772dbd;
      __it = __it + 4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = ((long)ppVar6 - (long)ppVar3 >> 3) * -0x3333333333333333;
  if (lVar7 == 1) {
LAB_00772da6:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::{lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)#2}>
            ::operator()((_Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::_lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)_2_>
                          *)&local_70,ppVar3);
    ppVar5 = ppVar3;
    if (bVar2) goto LAB_00772dbd;
  }
  else {
    if (lVar7 == 2) {
LAB_00772d83:
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::{lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)#2}>
              ::operator()((_Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::_lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)_2_>
                            *)&local_70,ppVar3);
      ppVar5 = ppVar3;
      if (bVar2) goto LAB_00772dbd;
      ppVar3 = ppVar3 + 1;
      goto LAB_00772da6;
    }
    if (lVar7 == 3) {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::{lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)#2}>
              ::operator()((_Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::_lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)_2_>
                            *)&local_70,ppVar3);
      ppVar5 = ppVar3;
      if (bVar2) goto LAB_00772dbd;
      ppVar3 = ppVar3 + 1;
      goto LAB_00772d83;
    }
  }
  ppVar5 = ppVar6;
LAB_00772dbd:
  if (ppVar5 != ppVar6) {
    return ppVar5->first;
  }
  if (uVar1 == 0) {
    return yellow;
  }
  psVar4 = (system_error *)__cxa_allocate_exception(0x58);
  std::error_code::error_code<jsoncons::conv_errc,void>(&local_40,conversion_failed);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70.field_2._M_allocated_capacity._0_7_ = 0x206e6120746f4e;
  local_70.field_2._7_4_ = 0x6d756e65;
  local_70._M_string_length = 0xb;
  local_70.field_2._11_4_ = local_70.field_2._11_4_ & 0xffffff00;
  __ec_00._4_4_ = 0;
  __ec_00._M_value = local_40._M_value;
  *(undefined ***)(psVar4 + 0x50) = &PTR__json_exception_00b58738;
  __ec_00._M_cat = local_40._M_cat;
  std::system_error::system_error(psVar4,__ec_00,&local_70);
  *(undefined8 *)psVar4 = 0xb5b5d8;
  *(undefined8 *)(psVar4 + 0x50) = 0xb5b610;
  *(undefined8 *)(psVar4 + 0x20) = 0;
  *(undefined8 *)(psVar4 + 0x28) = 0;
  *(system_error **)(psVar4 + 0x30) = psVar4 + 0x40;
  *(undefined8 *)(psVar4 + 0x38) = 0;
  psVar4[0x40] = (system_error)0x0;
  __cxa_throw(psVar4,&conv_error::typeinfo,conv_error::~conv_error);
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }